

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>::
execute_draw_test(SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL> *this,
                 TestShaderType tested_shader_type,string *function_definition,string *function_use,
                 string *verification,bool use_original,bool expect_invalid_result)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestError *pTVar4;
  bool bVar5;
  bool bVar6;
  int local_144;
  int iStack_140;
  bool result;
  GLuint vao_id;
  GLuint texture_object_id;
  GLenum shader_type;
  GLchar *routine_name;
  GLuint routine_location;
  GLuint routine_index;
  GLuint framebuffer_object_id;
  uchar buffer [4];
  string *vertex_shader_source;
  string **local_d8;
  string *tess_eval_shader_source;
  string **local_b0;
  string *tess_ctrl_shader_source;
  string local_98;
  string *local_78;
  string *geometry_shader_source;
  string *local_50;
  string *fragment_shader_source;
  string *compute_shader_source;
  Functions *gl;
  bool expect_invalid_result_local;
  string *psStack_30;
  bool use_original_local;
  string *verification_local;
  string *function_use_local;
  string *function_definition_local;
  SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL> *pSStack_10;
  TestShaderType tested_shader_type_local;
  SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  gl._6_1_ = expect_invalid_result;
  gl._7_1_ = use_original;
  psStack_30 = verification;
  verification_local = function_use;
  function_use_local = function_definition;
  function_definition_local._4_4_ = tested_shader_type;
  pSStack_10 = this;
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).context_id);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  compute_shader_source = (string *)CONCAT44(extraout_var,iVar1);
  fragment_shader_source = (string *)empty_string_abi_cxx11_;
  prepare_fragment_shader
            ((string *)&geometry_shader_source,this,function_definition_local._4_4_,
             function_use_local,verification_local,psStack_30);
  local_50 = (string *)&geometry_shader_source;
  prepare_geometry_shader
            (&local_98,this,function_definition_local._4_4_,function_use_local,verification_local,
             psStack_30);
  local_78 = &local_98;
  prepare_tess_ctrl_shader
            ((string *)&tess_eval_shader_source,this,function_definition_local._4_4_,
             function_use_local,verification_local,psStack_30);
  local_b0 = &tess_eval_shader_source;
  prepare_tess_eval_shader
            ((string *)&vertex_shader_source,this,function_definition_local._4_4_,function_use_local
             ,verification_local,psStack_30);
  local_d8 = &vertex_shader_source;
  prepare_vertex_shader
            ((string *)&framebuffer_object_id,this,function_definition_local._4_4_,
             function_use_local,verification_local,psStack_30);
  if (function_definition_local._4_4_ < COMPUTE_SHADER_TYPE) {
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[9])(this,&framebuffer_object_id,local_50,0);
  }
  else {
    if (3 < function_definition_local._4_4_ - COMPUTE_SHADER_TYPE) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x2367);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[10])
              (this,&framebuffer_object_id,local_b0,local_d8,local_78,local_50,
               empty_string_abi_cxx11_,0,0);
  }
  std::__cxx11::string::~string((string *)&framebuffer_object_id);
  std::__cxx11::string::~string((string *)&vertex_shader_source);
  std::__cxx11::string::~string((string *)&tess_eval_shader_source);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&geometry_shader_source);
  routine_index = 0;
  routine_location = 0;
  routine_name._4_4_ = 0xffffffff;
  routine_name._0_4_ = 0xffffffff;
  _texture_object_id = "original_routine";
  vao_id = 0;
  iStack_140 = 0;
  local_144 = 0;
  switch(function_definition_local._4_4_) {
  case FRAGMENT_SHADER_TYPE:
    vao_id = 0x8b30;
    break;
  case VERTEX_SHADER_TYPE:
    vao_id = 0x8b31;
    break;
  case COMPUTE_SHADER_TYPE:
    vao_id = 0x91b9;
    break;
  case GEOMETRY_SHADER_TYPE:
    vao_id = 0x8dd9;
    break;
  case TESSELATION_CONTROL_SHADER_TYPE:
    vao_id = 0x8e88;
    break;
  case TESSELATION_EVALUATION_SHADER_TYPE:
    vao_id = 0x8e87;
    break;
  default:
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Invalid shader type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x2394);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if ((gl._7_1_ & 1) == 0) {
    _texture_object_id = "new_routine";
  }
  (**(code **)(compute_shader_source + 0xb4))
            ((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).program_object_id);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glUseProgram() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x239e);
  routine_name._4_4_ =
       (*(code *)compute_shader_source[0x54]._M_string_length)
                 ((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).program_object_id
                  ,vao_id,_texture_object_id);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glGetSubroutineIndex() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x23a2);
  routine_name._0_4_ =
       (*(code *)compute_shader_source[0x54].field_2._M_allocated_capacity)
                 ((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).program_object_id
                  ,vao_id,"routine");
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glGetSubroutineUniformLocation() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x23a5);
  if ((int)routine_name != 0) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Subroutine location is invalid",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x23a9);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*(code *)compute_shader_source[0xb3]._M_string_length)(vao_id,1,(long)&routine_name + 4);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glUniformSubroutinesuiv() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x23ad);
  if (iStack_140 != 0) {
    __assert_fail("0 == texture_object_id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x23b0,
                  "void glcts::ArraysOfArrays::SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>::execute_draw_test(typename TestCaseBase<API>::TestShaderType, const std::string &, const std::string &, const std::string &, bool, bool) [API = glcts::ArraysOfArrays::Interface::GL]"
                 );
  }
  (**(code **)((long)&compute_shader_source[0x37].field_2 + 8))(1,&stack0xfffffffffffffec0);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glGenTextures() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x23b2);
  (**(code **)((long)&compute_shader_source[5].field_2 + 8))(0xde1,iStack_140);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glBindTexture() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x23b5);
  (**(code **)(compute_shader_source + 0x9c))(0xde1,1,0x8058,1);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glTexStorage2D() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x23b8);
  if (routine_location != 0) {
    __assert_fail("0 == framebuffer_object_id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x23bb,
                  "void glcts::ArraysOfArrays::SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>::execute_draw_test(typename TestCaseBase<API>::TestShaderType, const std::string &, const std::string &, const std::string &, bool, bool) [API = glcts::ArraysOfArrays::Interface::GL]"
                 );
  }
  (*(code *)compute_shader_source[0x36].field_2._M_allocated_capacity)(1,&routine_location);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glGenFramebuffers() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x23bd);
  (**(code **)((long)&compute_shader_source[3].field_2 + 8))(0x8d40,routine_location);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glBindFramebuffer() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x23c0);
  (**(code **)(compute_shader_source + 0x35))(0x8d40,0x8ce0,0xde1,iStack_140,0);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glFramebufferTexture2D() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x23c3);
  (**(code **)(compute_shader_source + 0xd0))(0,0,1);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glViewport() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x23c6);
  if (local_144 != 0) {
    __assert_fail("0 == vao_id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x23c9,
                  "void glcts::ArraysOfArrays::SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>::execute_draw_test(typename TestCaseBase<API>::TestShaderType, const std::string &, const std::string &, const std::string &, bool, bool) [API = glcts::ArraysOfArrays::Interface::GL]"
                 );
  }
  (*(code *)compute_shader_source[0x38]._M_string_length)(1,&local_144);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glGenVertexArrays() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x23cb);
  (**(code **)((long)&compute_shader_source[6].field_2 + 8))(local_144);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glBindVertexArray() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x23ce);
  if (function_definition_local._4_4_ < COMPUTE_SHADER_TYPE) {
    (**(code **)((long)&compute_shader_source[0x29].field_2 + 8))(6,0,4);
    dVar2 = (**(code **)(compute_shader_source + 0x40))();
    glu::checkError(dVar2,"glDrawArrays() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x23d5);
  }
  else if (function_definition_local._4_4_ == GEOMETRY_SHADER_TYPE) {
    (**(code **)((long)&compute_shader_source[0x29].field_2 + 8))(0,0,1);
    dVar2 = (**(code **)(compute_shader_source + 0x40))();
    glu::checkError(dVar2,"glDrawArrays() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x23e4);
  }
  else {
    if (1 < function_definition_local._4_4_ - TESSELATION_CONTROL_SHADER_TYPE) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x23e8);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (**(code **)((long)&compute_shader_source[0x7e].field_2 + 8))(0x8e72,1);
    dVar2 = (**(code **)(compute_shader_source + 0x40))();
    glu::checkError(dVar2,"PatchParameteri",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x23dc);
    (**(code **)((long)&compute_shader_source[0x29].field_2 + 8))(0xe,0,1);
    dVar2 = (**(code **)(compute_shader_source + 0x40))();
    glu::checkError(dVar2,"glDrawArrays() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x23df);
  }
  (**(code **)((long)&compute_shader_source[0x90].field_2 + 8))(0x8ce0);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glReadBuffer() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x23ee);
  (**(code **)(compute_shader_source + 0x91))(0,0,1,1,0x1908,0x1401,&routine_index);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glReadPixels() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x23f1);
  bVar6 = (char)routine_index != -1;
  bVar5 = (bool)(gl._6_1_ & 1);
  (**(code **)(compute_shader_source + 0xb4))(0);
  (**(code **)((long)&compute_shader_source[5].field_2 + 8))(0xde1,0);
  (**(code **)((long)&compute_shader_source[3].field_2 + 8))(0x8d40,0);
  (**(code **)((long)&compute_shader_source[6].field_2 + 8))(0);
  (*(code *)compute_shader_source[0x22]._M_string_length)
            ((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).program_object_id);
  (this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).program_object_id = 0;
  (**(code **)(compute_shader_source + 0x24))(1,&stack0xfffffffffffffec0);
  iStack_140 = 0;
  (**(code **)(compute_shader_source + 0x22))(1,&routine_location);
  routine_location = 0;
  (*(code *)compute_shader_source[0x24].field_2._M_allocated_capacity)(1,&local_144);
  local_144 = 0;
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"An error ocurred while deleting generated objects.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x2407);
  if (bVar6 == bVar5) {
    return;
  }
  pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar4,"Invalid result was returned.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x240b);
  __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void SubroutineFunctionCalls1<API>::execute_draw_test(typename TestCaseBase<API>::TestShaderType tested_shader_type,
													  const std::string&						 function_definition,
													  const std::string& function_use, const std::string& verification,
													  bool use_original, bool expect_invalid_result)
{
	const glw::Functions& gl = this->context_id.getRenderContext().getFunctions();

	if (API::USE_ALL_SHADER_STAGES)
	{
		const std::string& compute_shader_source = empty_string;
		const std::string& fragment_shader_source =
			this->prepare_fragment_shader(tested_shader_type, function_definition, function_use, verification);
		const std::string& geometry_shader_source =
			this->prepare_geometry_shader(tested_shader_type, function_definition, function_use, verification);
		const std::string& tess_ctrl_shader_source =
			this->prepare_tess_ctrl_shader(tested_shader_type, function_definition, function_use, verification);
		const std::string& tess_eval_shader_source =
			this->prepare_tess_eval_shader(tested_shader_type, function_definition, function_use, verification);
		const std::string& vertex_shader_source =
			this->prepare_vertex_shader(tested_shader_type, function_definition, function_use, verification);

		switch (tested_shader_type)
		{
		case TestCaseBase<API>::VERTEX_SHADER_TYPE: /* Fall through */
		case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
			this->execute_positive_test(vertex_shader_source, fragment_shader_source, false, false);
			break;

		case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
		case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
		case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE: /* Fall through */
		case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
			this->execute_positive_test(vertex_shader_source, tess_ctrl_shader_source, tess_eval_shader_source,
										geometry_shader_source, fragment_shader_source, compute_shader_source, false,
										false);
			break;

		default:
			TCU_FAIL("Invalid enum");
			break;
		}
	}
	else
	{
		const std::string& fragment_shader_source =
			this->prepare_fragment_shader(tested_shader_type, function_definition, function_use, verification);
		const std::string& vertex_shader_source =
			this->prepare_vertex_shader(tested_shader_type, function_definition, function_use, verification);

		this->execute_positive_test(vertex_shader_source, fragment_shader_source, false, false);
	}

	/* We are now ready to verify whether the returned size is correct. */
	unsigned char	  buffer[4]			 = { 0 };
	glw::GLuint		   framebuffer_object_id = 0;
	glw::GLuint		   routine_index		 = -1;
	glw::GLuint		   routine_location		 = -1;
	const glw::GLchar* routine_name			 = "original_routine";
	glw::GLenum		   shader_type			 = 0;
	glw::GLuint		   texture_object_id	 = 0;
	glw::GLuint		   vao_id				 = 0;

	switch (tested_shader_type)
	{
	case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
		shader_type = GL_FRAGMENT_SHADER;
		break;
	case TestCaseBase<API>::VERTEX_SHADER_TYPE:
		shader_type = GL_VERTEX_SHADER;
		break;
	case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
		shader_type = GL_COMPUTE_SHADER;
		break;
	case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
		shader_type = GL_GEOMETRY_SHADER;
		break;
	case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
		shader_type = GL_TESS_CONTROL_SHADER;
		break;
	case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
		shader_type = GL_TESS_EVALUATION_SHADER;
		break;
	default:
		TCU_FAIL("Invalid shader type");
		break;
	}

	if (false == use_original)
	{
		routine_name = "new_routine";
	}

	gl.useProgram(this->program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed.");

	/* Select subroutine */
	routine_index = gl.getSubroutineIndex(this->program_object_id, shader_type, routine_name);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSubroutineIndex() failed.");

	routine_location = gl.getSubroutineUniformLocation(this->program_object_id, shader_type, "routine");
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSubroutineUniformLocation() failed.");

	if (0 != routine_location)
	{
		TCU_FAIL("Subroutine location is invalid");
	}

	gl.uniformSubroutinesuiv(shader_type, 1, &routine_index);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniformSubroutinesuiv() failed.");

	/* Prepre texture */
	assert(0 == texture_object_id);
	gl.genTextures(1, &texture_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() failed.");

	gl.bindTexture(GL_TEXTURE_2D, texture_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() failed.");

	gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() failed.");

	/* Prepare framebuffer */
	assert(0 == framebuffer_object_id);
	gl.genFramebuffers(1, &framebuffer_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() failed.");

	gl.bindFramebuffer(GL_FRAMEBUFFER, framebuffer_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() failed.");

	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texture_object_id, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() failed.");

	gl.viewport(0, 0, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() failed.");

	/* Set VAO */
	assert(0 == vao_id);
	gl.genVertexArrays(1, &vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() failed.");

	gl.bindVertexArray(vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() failed.");

	switch (tested_shader_type)
	{
	case TestCaseBase<API>::FRAGMENT_SHADER_TYPE: /* Fall through */
	case TestCaseBase<API>::VERTEX_SHADER_TYPE:
		gl.drawArrays(GL_TRIANGLE_FAN, 0, 4);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed.");
		break;

	case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE: /* Fall through */
	case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
		/* Tesselation patch set up */
		gl.patchParameteri(GL_PATCH_VERTICES, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "PatchParameteri");

		gl.drawArrays(GL_PATCHES, 0, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed.");
		break;

	case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
		gl.drawArrays(GL_POINTS, 0, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed.");
		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	/* Verify */
	gl.readBuffer(GL_COLOR_ATTACHMENT0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadBuffer() failed.");

	gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() failed.");

	const bool result = ((buffer[0] != 255) == expect_invalid_result);

	/* Delete generated objects. */
	gl.useProgram(0);
	gl.bindTexture(GL_TEXTURE_2D, 0);
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	gl.bindVertexArray(0);

	gl.deleteProgram(this->program_object_id);
	this->program_object_id = 0;

	gl.deleteTextures(1, &texture_object_id);
	texture_object_id = 0;

	gl.deleteFramebuffers(1, &framebuffer_object_id);
	framebuffer_object_id = 0;

	gl.deleteVertexArrays(1, &vao_id);
	vao_id = 0;

	GLU_EXPECT_NO_ERROR(gl.getError(), "An error ocurred while deleting generated objects.");

	if (!result)
	{
		TCU_FAIL("Invalid result was returned.");
	}
}